

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O1

void poly_marshal(uint8_t *out,poly *in)

{
  long lVar1;
  uint16_t *p;
  uint8_t *puVar2;
  
  lVar1 = 6;
  do {
    puVar2 = out;
    *puVar2 = *(uint8_t *)((long)in + lVar1 + -6);
    puVar2[1] = (char)*(undefined2 *)((long)in + lVar1 + -4) << 5 |
                *(byte *)((long)in + lVar1 + -5) & 0x1f;
    puVar2[2] = (uint8_t)(*(ushort *)((long)in + lVar1 + -4) >> 3);
    puVar2[3] = ((byte)((ushort)*(undefined2 *)((long)in + lVar1 + -4) >> 0xb) & 3) +
                (char)*(undefined2 *)((long)in + lVar1 + -2) * '\x04';
    puVar2[4] = (char)*(undefined2 *)((long)&in->field_0 + lVar1) << 7 |
                (byte)(*(ushort *)((long)in + lVar1 + -2) >> 6) & 0x7f;
    puVar2[5] = (uint8_t)(*(ushort *)((long)&in->field_0 + lVar1) >> 1);
    puVar2[6] = (char)*(undefined2 *)((long)&in->field_0 + lVar1 + 2) << 4 |
                (byte)((ushort)*(undefined2 *)((long)&in->field_0 + lVar1) >> 9) & 0xf;
    puVar2[7] = (uint8_t)(*(ushort *)((long)&in->field_0 + lVar1 + 2) >> 4);
    puVar2[8] = ((byte)((ushort)*(undefined2 *)((long)&in->field_0 + lVar1 + 2) >> 0xc) & 1) +
                (char)*(undefined2 *)((long)&in->field_0 + lVar1 + 4) * '\x02';
    puVar2[9] = (char)*(undefined2 *)((long)&in->field_0 + lVar1 + 6) << 6 |
                (byte)(*(ushort *)((long)&in->field_0 + lVar1 + 4) >> 7) & 0x3f;
    puVar2[10] = (uint8_t)(*(ushort *)((long)&in->field_0 + lVar1 + 6) >> 2);
    puVar2[0xb] = ((byte)((ushort)*(undefined2 *)((long)&in->field_0 + lVar1 + 6) >> 10) & 7) +
                  (char)*(undefined2 *)((long)&in->field_0 + lVar1 + 8) * '\b';
    puVar2[0xc] = (uint8_t)(*(ushort *)((long)&in->field_0 + lVar1 + 8) >> 5);
    lVar1 = lVar1 + 0x10;
    out = puVar2 + 0xd;
  } while (lVar1 != 0x576);
  puVar2[0xd] = *(uint8_t *)((long)&in->field_0 + 0x570);
  puVar2[0xe] = (char)(in->field_0).v[0x2b9] << 5 | *(byte *)((long)&in->field_0 + 0x571) & 0x1f;
  puVar2[0xf] = (uint8_t)((in->field_0).v[0x2b9] >> 3);
  puVar2[0x10] = ((byte)((in->field_0).v[0x2b9] >> 0xb) & 3) + (char)(in->field_0).v[0x2ba] * '\x04'
  ;
  puVar2[0x11] = (char)(in->field_0).v[699] << 7 | (byte)((in->field_0).v[0x2ba] >> 6) & 0x7f;
  puVar2[0x12] = (uint8_t)((in->field_0).v[699] >> 1);
  puVar2[0x13] = (byte)((in->field_0).v[699] >> 9) & 0xf;
  return;
}

Assistant:

static void poly_marshal(uint8_t out[POLY_BYTES], const struct poly *in) {
  const uint16_t *p = in->v;

  for (size_t i = 0; i < N / 8; i++) {
    out[0] = p[0];
    out[1] = (0x1f & (p[0] >> 8)) | ((p[1] & 0x07) << 5);
    out[2] = p[1] >> 3;
    out[3] = (3 & (p[1] >> 11)) | ((p[2] & 0x3f) << 2);
    out[4] = (0x7f & (p[2] >> 6)) | ((p[3] & 0x01) << 7);
    out[5] = p[3] >> 1;
    out[6] = (0xf & (p[3] >> 9)) | ((p[4] & 0x0f) << 4);
    out[7] = p[4] >> 4;
    out[8] = (1 & (p[4] >> 12)) | ((p[5] & 0x7f) << 1);
    out[9] = (0x3f & (p[5] >> 7)) | ((p[6] & 0x03) << 6);
    out[10] = p[6] >> 2;
    out[11] = (7 & (p[6] >> 10)) | ((p[7] & 0x1f) << 3);
    out[12] = p[7] >> 5;

    p += 8;
    out += 13;
  }

  // There are four remaining values.
  out[0] = p[0];
  out[1] = (0x1f & (p[0] >> 8)) | ((p[1] & 0x07) << 5);
  out[2] = p[1] >> 3;
  out[3] = (3 & (p[1] >> 11)) | ((p[2] & 0x3f) << 2);
  out[4] = (0x7f & (p[2] >> 6)) | ((p[3] & 0x01) << 7);
  out[5] = p[3] >> 1;
  out[6] = 0xf & (p[3] >> 9);
}